

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall NLReaderTest_PassObj_Test::TestBody(NLReaderTest_PassObj_Test *this)

{
  MockSpec<bool_(int)> *this_00;
  TypedExpectation<bool_(int)> *this_01;
  MockSpec<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)> *this_02;
  TypedExpectation<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  *this_03;
  int in_R9D;
  NLStringRef str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  string local_488;
  NLHeader header;
  NiceMock<MockNLHandler> handler;
  
  testing::NiceMock<MockNLHandler>::NiceMock(&handler);
  testing::Matcher<int>::Matcher((Matcher<int> *)&header,0);
  this_00 = MockNLHandler::gmock_NeedObj(&handler.super_MockNLHandler,(Matcher<int> *)&header);
  this_01 = testing::internal::MockSpec<bool_(int)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x556,"handler","NeedObj(0)");
  local_488._M_dataplus._M_p._0_1_ = 1;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_4a8);
  testing::internal::TypedExpectation<bool_(int)>::WillOnce
            (this_01,(Action<bool_(int)> *)&local_4a8);
  testing::internal::linked_ptr<testing::ActionInterface<bool_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_(int)>_> *)&local_4a8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&header);
  testing::Matcher<int>::Matcher((Matcher<int> *)&header,0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_4a8,1);
  this_02 = MockNLHandler::gmock_OnLinearObjExpr
                      (&handler.super_MockNLHandler,(Matcher<int> *)&header,
                       (Matcher<int> *)&local_4a8);
  this_03 = testing::internal::
            MockSpec<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x557,"handler","OnLinearObjExpr(0, 1)");
  local_488._M_dataplus._M_p = (pointer)operator_new(0x10);
  *(undefined ***)local_488._M_dataplus._M_p = &PTR__ActionInterface_002b4610;
  local_488._M_string_length = (size_type)&local_488._M_string_length;
  testing::internal::
  TypedExpectation<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>::
  WillOnce(this_03,(Action<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
                    *)&local_488);
  testing::internal::
  linked_ptr<testing::ActionInterface<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>_>
                 *)&local_488);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&local_4a8);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&header);
  memset(&header,0,0x110);
  mp::NLHeader::NLHeader(&header);
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = 1;
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_objs = 1;
  FormatHeader_abi_cxx11_(&local_488,&header,true);
  std::operator+(&local_4a8,&local_488,"G0 1\n0 1\n");
  str.size_ = (size_t)&handler;
  str.data_ = (char *)local_4a8._M_string_length;
  mp::ReadNLString<testing::NiceMock<MockNLHandler>>
            ((mp *)local_4a8._M_dataplus._M_p,str,(NiceMock<MockNLHandler> *)"(input)",
             (CStringRef)0x0,in_R9D);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  testing::NiceMock<MockNLHandler>::~NiceMock(&handler);
  return;
}

Assistant:

TEST(NLReaderTest, PassObj) {
  testing::NiceMock<MockNLHandler> handler;
  EXPECT_CALL(handler, NeedObj(0)).WillOnce(Return(true));
  EXPECT_CALL(handler, OnLinearObjExpr(0, 1)).
      WillOnce(Return(MockNLHandler::LinearObjHandler()));
  auto header = NLHeader();
  header.num_vars = header.num_objs = 1;
  ReadNLString(FormatHeader(header) + "G0 1\n0 1\n", handler);
}